

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_temporal_filter_sse2.c
# Opt level: O0

void xx_load_and_pad(uint32_t *src,__m128i *dstvec,int col,int block_width)

{
  longlong lVar1;
  longlong lVar2;
  undefined8 uStack_60;
  longlong local_58;
  __m128i vtmp2;
  __m128i vtmp1;
  int block_width_local;
  int col_local;
  __m128i *dstvec_local;
  uint32_t *src_local;
  
  local_58 = *(longlong *)src;
  lVar1 = *(longlong *)(src + 2);
  lVar2 = *(longlong *)(src + 4);
  uStack_60 = *(longlong *)(src + 6);
  if (col == 0) {
    vtmp1[1]._0_4_ = (undefined4)lVar1;
    local_58 = CONCAT44((undefined4)vtmp1[1],(undefined4)vtmp1[1]);
  }
  (*dstvec)[0] = local_58;
  (*dstvec)[1] = lVar1;
  if (block_width + -4 <= col) {
    vtmp2[0]._4_4_ = (undefined4)((ulong)lVar2 >> 0x20);
    uStack_60 = CONCAT44(vtmp2[0]._4_4_,vtmp2[0]._4_4_);
  }
  dstvec[1][0] = lVar2;
  dstvec[1][1] = uStack_60;
  return;
}

Assistant:

static void xx_load_and_pad(uint32_t *src, __m128i *dstvec, int col,
                            int block_width) {
  __m128i vtmp1 = _mm_loadu_si128((__m128i *)src);
  __m128i vtmp2 = _mm_loadu_si128((__m128i *)(src + 4));
  // For the first column, replicate the first element twice to the left
  dstvec[0] = (col) ? vtmp1 : _mm_shuffle_epi32(vtmp1, 0xEA);
  // For the last column, replicate the last element twice to the right
  dstvec[1] = (col < block_width - 4) ? vtmp2 : _mm_shuffle_epi32(vtmp2, 0x54);
}